

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlcatalog.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  FILE *pFVar8;
  byte *__ptr;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  byte *__s;
  int local_2e8;
  long local_2d8 [20];
  char command [100];
  char arg [400];
  
  if (argc < 2) {
LAB_00101378:
    pcVar13 = *argv;
LAB_0010137b:
    usage(pcVar13);
    return 1;
  }
  iVar15 = 1;
  xmlCheckVersion(0x526c);
LAB_001013ab:
  iVar3 = sgml;
  if (((argc <= iVar15) || (pcVar13 = argv[iVar15], *pcVar13 != '-')) || (pcVar13[1] == '\0'))
  goto LAB_001015d6;
  iVar3 = strcmp(pcVar13,"-verbose");
  if (((iVar3 == 0) || ((pcVar13[1] == 'v' && (pcVar13[2] == '\0')))) ||
     (iVar3 = strcmp(pcVar13,"--verbose"), iVar3 == 0)) {
    verbose = verbose + 1;
    xmlCatalogSetDebug();
  }
  else {
    iVar3 = strcmp(pcVar13,"-noout");
    if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--noout"), iVar3 != 0)) {
      iVar3 = strcmp(pcVar13,"-shell");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--shell"), iVar3 != 0)) {
        iVar3 = strcmp(pcVar13,"-sgml");
        if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--sgml"), iVar3 == 0)) {
          sgml = sgml + 1;
        }
        else {
          iVar3 = strcmp(pcVar13,"-create");
          if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--create"), iVar3 == 0)) {
            create = create + 1;
          }
          else {
            iVar3 = strcmp(pcVar13,"-convert");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--convert"), iVar3 == 0)) {
              convert = convert + 1;
            }
            else {
              iVar3 = strcmp(pcVar13,"-no-super-update");
              if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--no-super-update"), iVar3 == 0)) {
                no_super_update = no_super_update + 1;
              }
              else {
                iVar3 = strcmp(pcVar13,"-add");
                if ((iVar3 != 0) && (iVar3 = strcmp(pcVar13,"--add"), iVar3 != 0)) {
                  iVar3 = strcmp(pcVar13,"-del");
                  if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--del"), iVar3 == 0)) {
                    iVar15 = iVar15 + 1;
                    del = del + 1;
                    goto LAB_0010159b;
                  }
                  fprintf(_stderr,"Unknown option %s\n",pcVar13);
                  goto LAB_00101378;
                }
                iVar15 = iVar15 + 2 + (uint)(sgml == 0);
                add = add + 1;
              }
            }
          }
        }
        goto LAB_0010159b;
      }
      shell = shell + 1;
    }
    noout = 1;
  }
LAB_0010159b:
  iVar15 = iVar15 + 1;
  goto LAB_001013ab;
LAB_001015d6:
  iVar15 = 1;
  while (iVar15 < argc) {
    pcVar13 = argv[iVar15];
    iVar4 = strcmp(pcVar13,"-add");
    if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--add"), iVar4 == 0)) {
      if (iVar3 == 0) {
        iVar4 = iVar15 + 3;
      }
      else {
        iVar4 = iVar15 + 2;
      }
    }
    else {
      iVar4 = strcmp(pcVar13,"-del");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--del"), iVar4 == 0)) {
        iVar4 = iVar15 + 1;
        if ((iVar4 == argc) || ((iVar3 != 0 && (iVar15 + 2 == argc)))) {
          fwrite("No catalog entry specified to remove from\n",0x2a,1,_stderr);
          pcVar13 = *argv;
          goto LAB_0010137b;
        }
      }
      else {
        iVar4 = iVar15;
        if (*pcVar13 != '-') {
          if ((*pcVar13 == '\0') && (filename == (char *)0x0)) {
            xmlInitializeCatalog();
          }
          else {
            filename = pcVar13;
            iVar3 = xmlLoadCatalog(pcVar13);
            if ((iVar3 < 0) && (create != 0)) {
              xmlCatalogAdd("catalog",argv[iVar15],0);
            }
          }
          break;
        }
      }
    }
    iVar15 = iVar4 + 1;
  }
  if (convert != 0) {
    xmlCatalogConvert();
  }
  if (del == 0 && add == 0) {
    if (shell == 0) {
      lVar6 = (long)iVar15;
      local_2e8 = 0;
      while (lVar6 = lVar6 + 1, lVar6 < (long)(ulong)(uint)argc) {
        lVar7 = xmlParseURI(argv[lVar6]);
        if (lVar7 == 0) {
          pcVar13 = (char *)xmlCatalogResolvePublic(argv[lVar6]);
          if (pcVar13 != (char *)0x0) goto LAB_001020e2;
          pcVar13 = argv[lVar6];
          pcVar14 = "No entry for PUBLIC %s\n";
LAB_0010211a:
          printf(pcVar14,pcVar13);
          local_2e8 = 4;
        }
        else {
          xmlFreeURI(lVar7);
          pcVar13 = (char *)xmlCatalogResolveSystem(argv[lVar6]);
          if (pcVar13 == (char *)0x0) {
            printf("No entry for SYSTEM %s\n",argv[lVar6]);
            pcVar13 = (char *)xmlCatalogResolveURI(argv[lVar6]);
            if (pcVar13 == (char *)0x0) {
              pcVar13 = argv[lVar6];
              pcVar14 = "No entry for URI %s\n";
              goto LAB_0010211a;
            }
          }
LAB_001020e2:
          puts(pcVar13);
          (*_xmlFree)(pcVar13);
        }
      }
    }
    else {
      while( true ) {
        __s = (byte *)arg;
        __ptr = (byte *)readline("> ");
        if (__ptr == (byte *)0x0) break;
        pbVar11 = __ptr;
        if (*__ptr != 0) {
          add_history(__ptr);
        }
        for (; (bVar1 = *pbVar11, bVar1 == 9 || (bVar1 == 0x20)); pbVar11 = pbVar11 + 1) {
        }
        uVar9 = 0;
        while ((0x20 < bVar1 || ((0x100002601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))) {
          command[uVar9] = bVar1;
          bVar1 = pbVar11[uVar9 + 1];
          uVar9 = uVar9 + 1;
        }
        command[uVar9 & 0xffffffff] = '\0';
        if (uVar9 != 0) {
          memset(__s,0,400);
          for (pbVar11 = pbVar11 + uVar9; (bVar1 = *pbVar11, bVar1 == 9 || (bVar1 == 0x20));
              pbVar11 = pbVar11 + 1) {
          }
          uVar9 = 0;
          while ((0xd < bVar1 || ((0x2401U >> (bVar1 & 0x1f) & 1) == 0))) {
            arg[uVar9] = bVar1;
            bVar1 = pbVar11[uVar9 + 1];
            uVar9 = uVar9 + 1;
          }
          arg[uVar9 & 0xffffffff] = '\0';
          uVar10 = 0;
          memset(local_2d8,0,0xa0);
          do {
            uVar9 = (ulong)uVar10;
LAB_00101be0:
            bVar1 = *__s;
            pbVar11 = __s;
            if (bVar1 == 0) {
              iVar15 = bcmp(command,"exit",5);
              if (((iVar15 == 0) ||
                  (iVar15 = bcmp(command,"quit",5), uVar2 = command._0_4_, iVar15 == 0)) ||
                 (command._0_4_ == 0x657962)) {
                free(__ptr);
                goto LAB_0010213a;
              }
              iVar15 = bcmp(command,"public",7);
              if (iVar15 == 0) {
                if (uVar10 != 1) {
                  puts("public requires 1 arguments");
                  break;
                }
                pcVar13 = (char *)xmlCatalogResolvePublic(local_2d8[0]);
                if (pcVar13 == (char *)0x0) {
                  pcVar13 = "No entry for PUBLIC %s\n";
LAB_00101f7a:
                  printf(pcVar13);
                  break;
                }
LAB_00101d77:
                puts(pcVar13);
              }
              else {
                iVar15 = bcmp(command,"system",7);
                if (iVar15 == 0) {
                  if (uVar10 == 1) {
                    pcVar13 = (char *)xmlCatalogResolveSystem(local_2d8[0]);
                    if (pcVar13 == (char *)0x0) {
                      pcVar13 = "No entry for SYSTEM %s\n";
                      goto LAB_00101f7a;
                    }
                    goto LAB_00101d77;
                  }
                  pcVar13 = "system requires 1 arguments";
LAB_00101e71:
                  puts(pcVar13);
                  break;
                }
                if (uVar2 == 0x6c6564) {
                  if (uVar10 != 1) {
                    pcVar13 = "del requires 1";
                    goto LAB_00101e71;
                  }
                  iVar15 = xmlCatalogRemove(local_2d8[0]);
                  if (iVar15 < 1) {
                    pcVar13 = "del command failed";
LAB_00101fc9:
                    puts(pcVar13);
                  }
                  break;
                }
                if (uVar2 == 0x646461) {
                  if (uVar10 - 4 < 0xfffffffe) {
                    pcVar13 = "add requires 2 or 3 arguments";
LAB_00101fa7:
                    puts(pcVar13);
                  }
                  else {
                    lVar6 = local_2d8[2];
                    lVar7 = local_2d8[1];
                    if (local_2d8[2] == 0) {
                      lVar6 = local_2d8[1];
                      lVar7 = 0;
                    }
                    iVar15 = xmlCatalogAdd(local_2d8[0],lVar7,lVar6);
                    if (iVar15 != 0) {
                      pcVar13 = "add command failed";
                      goto LAB_00101fc9;
                    }
                  }
                  break;
                }
                if (CONCAT44(command._4_4_,command._0_4_) != 0x65766c6f736572) {
                  iVar15 = bcmp(command,"dump",5);
                  if (iVar15 == 0) {
                    if (uVar9 == 0) {
                      xmlCatalogDump(_stdout);
                      break;
                    }
                    pcVar13 = "dump has no arguments";
                  }
                  else {
                    iVar15 = bcmp(command,"debug",6);
                    if (iVar15 == 0) {
                      if (uVar9 == 0) {
                        verbose = verbose + 1;
                        xmlCatalogSetDebug();
                        break;
                      }
                      pcVar13 = "debug has no arguments";
                    }
                    else {
                      iVar15 = bcmp(command,"quiet",6);
                      if (iVar15 == 0) {
                        if (uVar9 != 0) {
                          pcVar13 = "quiet has no arguments";
                          goto LAB_00101fc9;
                        }
                        if (0 < verbose) {
                          verbose = verbose + -1;
                        }
                        xmlCatalogSetDebug();
                        break;
                      }
                      iVar15 = bcmp(command,"help",5);
                      if (iVar15 != 0) {
                        printf("Unrecognized command %s\n");
                      }
                      puts("Commands available:");
                      puts("\tpublic PublicID: make a PUBLIC identifier lookup");
                      puts("\tsystem SystemID: make a SYSTEM identifier lookup");
                      puts("\tresolve PublicID SystemID: do a full resolver lookup");
                      puts("\tadd \'type\' \'orig\' \'replace\' : add an entry");
                      puts("\tdel \'values\' : remove values");
                      puts("\tdump: print the current catalog state");
                      puts("\tdebug: increase the verbosity level");
                      puts("\tquiet: decrease the verbosity level");
                      pcVar13 = "\texit:  quit the shell";
                    }
                  }
                  puts(pcVar13);
                  break;
                }
                if (uVar10 != 2) {
                  pcVar13 = "resolve requires 2 arguments";
                  goto LAB_00101fa7;
                }
                pcVar13 = (char *)xmlCatalogResolve(local_2d8[0]);
                if (pcVar13 == (char *)0x0) {
                  pcVar13 = "Resolver failed to find an answer";
                  goto LAB_00101e71;
                }
                puts(pcVar13);
              }
              (*_xmlFree)(pcVar13);
              break;
            }
            while ((__s = pbVar11 + 1, bVar1 == 9 || (bVar1 == 0x20))) {
              pbVar11 = __s;
              bVar1 = *__s;
            }
            if (bVar1 == 0x22) {
              local_2d8[uVar9] = (long)__s;
              for (; *__s != 0; __s = __s + 1) {
                if (*__s == 0x22) goto LAB_00101c51;
              }
              goto LAB_00101be0;
            }
            if (bVar1 == 0x27) {
              local_2d8[uVar9] = (long)__s;
              for (; *__s != 0; __s = __s + 1) {
                if (*__s == 0x27) goto LAB_00101c51;
              }
              goto LAB_00101be0;
            }
            local_2d8[uVar9] = (long)pbVar11;
            while ((0x20 < (ulong)*pbVar11 ||
                   (__s = pbVar11, (0x100000201U >> ((ulong)*pbVar11 & 0x3f) & 1) == 0))) {
              pbVar11 = pbVar11 + 1;
            }
LAB_00101c51:
            *__s = 0;
            uVar10 = uVar10 + 1;
            __s = __s + 1;
          } while( true );
        }
        free(__ptr);
      }
LAB_0010213a:
      local_2e8 = 0;
    }
  }
  else {
    local_2e8 = 0;
    iVar15 = 1;
    while (iVar15 < argc) {
      pcVar13 = argv[iVar15];
      iVar3 = iVar15;
      if (*pcVar13 == '-') {
        if (pcVar13[1] == '\0') break;
        iVar4 = strcmp(pcVar13,"-add");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--add"), iVar4 == 0)) {
          if (sgml == 0) {
LAB_0010190e:
            pcVar13 = argv[(long)iVar15 + 3];
            if ((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) {
              pcVar14 = argv[(long)iVar15 + 1];
              pcVar13 = argv[(long)iVar15 + 2];
              pcVar12 = (char *)0x0;
            }
            else {
              pcVar14 = argv[(long)iVar15 + 1];
              pcVar12 = argv[(long)iVar15 + 2];
            }
            iVar4 = xmlCatalogAdd(pcVar14,pcVar12,pcVar13);
            iVar3 = iVar15 + 3;
            if (iVar4 != 0) {
              puts("add command failed");
              local_2e8 = 3;
            }
          }
          else {
LAB_001017fa:
            lVar6 = xmlLoadSGMLSuperCatalog(argv[(long)iVar15 + 1]);
            pcVar13 = argv[iVar15];
            iVar3 = strcmp(pcVar13,"-add");
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar13,"--add"), iVar3 == 0)) {
              if (lVar6 == 0) {
                lVar6 = xmlNewCatalog(1);
              }
              xmlACatalogAdd(lVar6,"CATALOG",argv[(long)iVar15 + 2],0);
              if (no_super_update == 0) {
                lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog");
                if (lVar7 == 0) {
                  lVar7 = xmlNewCatalog(1);
                }
                xmlACatalogAdd(lVar7,"CATALOG",argv[(long)iVar15 + 1],0);
              }
              else {
LAB_00101906:
                lVar7 = 0;
              }
LAB_0010198f:
              if (noout != 0) goto LAB_00101998;
LAB_001019b9:
              xmlACatalogDump(lVar6,_stdout);
            }
            else {
              if ((lVar6 == 0) ||
                 (iVar3 = xmlACatalogRemove(lVar6,argv[(long)iVar15 + 2]), iVar3 < 0)) {
                fprintf(_stderr,"Failed to remove entry from %s\n",argv[(long)iVar15 + 1]);
                local_2e8 = 1;
              }
              if (((lVar6 != 0) && (no_super_update == 0)) && ((noout & 1) != 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar6);
                if ((iVar3 == 0) ||
                   (lVar7 = xmlLoadSGMLSuperCatalog("/usr/local/etc/sgml/catalog"), lVar7 == 0))
                goto LAB_00101906;
                iVar3 = xmlACatalogRemove(lVar7,argv[(long)iVar15 + 1]);
                if (iVar3 < 0) {
                  fprintf(_stderr,"Failed to remove entry from %s\n","/usr/local/etc/sgml/catalog");
                  local_2e8 = 1;
                }
                goto LAB_0010198f;
              }
              if ((noout & 1) == 0) goto LAB_001019b9;
              lVar7 = 0;
LAB_00101998:
              iVar3 = xmlCatalogIsEmpty(lVar6);
              if (iVar3 == 0) {
                pFVar8 = fopen64(argv[(long)iVar15 + 1],"w");
                if (pFVar8 == (FILE *)0x0) {
                  fprintf(_stderr,"could not open %s for saving\n",argv[(long)iVar15 + 1]);
                  noout = 0;
                  local_2e8 = 2;
                }
                else {
                  xmlACatalogDump(lVar6,pFVar8);
                  fclose(pFVar8);
                }
              }
              else {
                remove(argv[(long)iVar15 + 1]);
              }
              if ((lVar7 != 0) && (no_super_update == 0)) {
                iVar3 = xmlCatalogIsEmpty(lVar7);
                if (iVar3 == 0) {
                  pFVar8 = fopen64("/usr/local/etc/sgml/catalog","w");
                  if (pFVar8 == (FILE *)0x0) {
                    fprintf(_stderr,"could not open %s for saving\n","/usr/local/etc/sgml/catalog");
                    noout = 0;
                    local_2e8 = 2;
                  }
                  else {
                    xmlACatalogDump(lVar7,pFVar8);
                    fclose(pFVar8);
                  }
                }
                else {
                  remove("/usr/local/etc/sgml/catalog");
                }
              }
            }
            iVar3 = iVar15 + 2;
          }
        }
        else {
          iVar5 = strcmp(pcVar13,"-del");
          if ((iVar5 == 0) || (iVar5 = strcmp(pcVar13,"--del"), iVar5 == 0)) {
            if (sgml != 0) goto LAB_001017fa;
            if (iVar4 == 0) goto LAB_0010190e;
            iVar4 = strcmp(pcVar13,"-del");
            if ((iVar4 == 0) || (iVar4 = strcmp(pcVar13,"--del"), iVar4 == 0)) {
              iVar3 = iVar15 + 1;
              iVar4 = xmlCatalogRemove(argv[(long)iVar15 + 1]);
              if (iVar4 < 0) {
                fprintf(_stderr,"Failed to remove entry %s\n",argv[(long)iVar15 + 1]);
                local_2e8 = 1;
              }
            }
          }
        }
      }
      iVar15 = iVar3 + 1;
    }
  }
  if ((sgml == 0) && ((((add != 0 || (del != 0)) || (create != 0)) || (convert != 0)))) {
    pFVar8 = _stdout;
    if ((((filename != (char *)0x0 & noout) == 1) && (*filename != '\0')) &&
       (pFVar8 = fopen64(filename,"w"), pFVar8 == (FILE *)0x0)) {
      local_2e8 = 2;
      fprintf(_stderr,"could not open %s for saving\n",filename);
      noout = 0;
    }
    else {
      xmlCatalogDump(pFVar8);
    }
  }
  xmlCleanupParser();
  xmlMemoryDump();
  return local_2e8;
}

Assistant:

int main(int argc, char **argv) {
    int i;
    int ret;
    int exit_value = 0;


    if (argc <= 1) {
	usage(argv[0]);
	return(1);
    }

    LIBXML_TEST_VERSION
    for (i = 1; i < argc ; i++) {
	if (!strcmp(argv[i], "-"))
	    break;

	if (argv[i][0] != '-')
	    break;
	if ((!strcmp(argv[i], "-verbose")) ||
	    (!strcmp(argv[i], "-v")) ||
	    (!strcmp(argv[i], "--verbose"))) {
	    verbose++;
	    xmlCatalogSetDebug(verbose);
	} else if ((!strcmp(argv[i], "-noout")) ||
	    (!strcmp(argv[i], "--noout"))) {
            noout = 1;
	} else if ((!strcmp(argv[i], "-shell")) ||
	    (!strcmp(argv[i], "--shell"))) {
	    shell++;
            noout = 1;
	} else if ((!strcmp(argv[i], "-sgml")) ||
	    (!strcmp(argv[i], "--sgml"))) {
	    sgml++;
	} else if ((!strcmp(argv[i], "-create")) ||
	    (!strcmp(argv[i], "--create"))) {
	    create++;
	} else if ((!strcmp(argv[i], "-convert")) ||
	    (!strcmp(argv[i], "--convert"))) {
	    convert++;
	} else if ((!strcmp(argv[i], "-no-super-update")) ||
	    (!strcmp(argv[i], "--no-super-update"))) {
	    no_super_update++;
	} else if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    add++;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;
	    del++;
	} else {
	    fprintf(stderr, "Unknown option %s\n", argv[i]);
	    usage(argv[0]);
	    return(1);
	}
    }

    for (i = 1; i < argc; i++) {
	if ((!strcmp(argv[i], "-add")) ||
	    (!strcmp(argv[i], "--add"))) {
	    if (sgml)
		i += 2;
	    else
		i += 3;
	    continue;
	} else if ((!strcmp(argv[i], "-del")) ||
	    (!strcmp(argv[i], "--del"))) {
	    i += 1;

	    /* No catalog entry specified */
	    if (i == argc || (sgml && i + 1 == argc)) {
		fprintf(stderr, "No catalog entry specified to remove from\n");
		usage (argv[0]);
		return(1);
	    }

	    continue;
	} else if (argv[i][0] == '-')
	    continue;

	if (filename == NULL && argv[i][0] == '\0') {
	    /* Interpret empty-string catalog specification as
	       a shortcut for a default system catalog. */
	    xmlInitializeCatalog();
	} else {
	    filename = argv[i];
	    ret = xmlLoadCatalog(argv[i]);
	    if ((ret < 0) && (create)) {
		xmlCatalogAdd(BAD_CAST "catalog", BAD_CAST argv[i], NULL);
	    }
	}
	break;
    }

    if (convert)
        ret = xmlCatalogConvert();

    if ((add) || (del)) {
	for (i = 1; i < argc ; i++) {
	    if (!strcmp(argv[i], "-"))
		break;

	    if (argv[i][0] != '-')
		continue;
	    if (strcmp(argv[i], "-add") && strcmp(argv[i], "--add") &&
		strcmp(argv[i], "-del") && strcmp(argv[i], "--del"))
		continue;

	    if (sgml) {
		/*
		 * Maintenance of SGML catalogs.
		 */
		xmlCatalogPtr catal = NULL;
		xmlCatalogPtr super = NULL;

		catal = xmlLoadSGMLSuperCatalog(argv[i + 1]);

		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
		    if (catal == NULL)
			catal = xmlNewCatalog(1);
		    xmlACatalogAdd(catal, BAD_CAST "CATALOG",
					 BAD_CAST argv[i + 2], NULL);

		    if (!no_super_update) {
			super = xmlLoadSGMLSuperCatalog(XML_SGML_DEFAULT_CATALOG);
			if (super == NULL)
			    super = xmlNewCatalog(1);

			xmlACatalogAdd(super, BAD_CAST "CATALOG",
					     BAD_CAST argv[i + 1], NULL);
		    }
		} else {
		    if (catal != NULL)
			ret = xmlACatalogRemove(catal, BAD_CAST argv[i + 2]);
		    else
			ret = -1;
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry from %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    if ((!no_super_update) && (noout) && (catal != NULL) &&
			(xmlCatalogIsEmpty(catal))) {
			super = xmlLoadSGMLSuperCatalog(
				   XML_SGML_DEFAULT_CATALOG);
			if (super != NULL) {
			    ret = xmlACatalogRemove(super,
				    BAD_CAST argv[i + 1]);
			    if (ret < 0) {
				fprintf(stderr,
					"Failed to remove entry from %s\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 1;
			    }
			}
		    }
		}
		if (noout) {
		    FILE *out;

		    if (xmlCatalogIsEmpty(catal)) {
			remove(argv[i + 1]);
		    } else {
			out = fopen(argv[i + 1], "w");
			if (out == NULL) {
			    fprintf(stderr, "could not open %s for saving\n",
				    argv[i + 1]);
			    exit_value = 2;
			    noout = 0;
			} else {
			    xmlACatalogDump(catal, out);
			    fclose(out);
			}
		    }
		    if (!no_super_update && super != NULL) {
			if (xmlCatalogIsEmpty(super)) {
			    remove(XML_SGML_DEFAULT_CATALOG);
			} else {
			    out = fopen(XML_SGML_DEFAULT_CATALOG, "w");
			    if (out == NULL) {
				fprintf(stderr,
					"could not open %s for saving\n",
					XML_SGML_DEFAULT_CATALOG);
				exit_value = 2;
				noout = 0;
			    } else {

				xmlACatalogDump(super, out);
				fclose(out);
			    }
			}
		    }
		} else {
		    xmlACatalogDump(catal, stdout);
		}
		i += 2;
	    } else {
		if ((!strcmp(argv[i], "-add")) ||
		    (!strcmp(argv[i], "--add"))) {
			if ((argv[i + 3] == NULL) || (argv[i + 3][0] == 0))
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1], NULL,
						BAD_CAST argv[i + 2]);
			else
			    ret = xmlCatalogAdd(BAD_CAST argv[i + 1],
						BAD_CAST argv[i + 2],
						BAD_CAST argv[i + 3]);
			if (ret != 0) {
			    printf("add command failed\n");
			    exit_value = 3;
			}
			i += 3;
		} else if ((!strcmp(argv[i], "-del")) ||
		    (!strcmp(argv[i], "--del"))) {
		    ret = xmlCatalogRemove(BAD_CAST argv[i + 1]);
		    if (ret < 0) {
			fprintf(stderr, "Failed to remove entry %s\n",
				argv[i + 1]);
			exit_value = 1;
		    }
		    i += 1;
		}
	    }
	}

    } else if (shell) {
	usershell();
    } else {
	for (i++; i < argc; i++) {
	    xmlURIPtr uri;
	    xmlChar *ans;

	    uri = xmlParseURI(argv[i]);
	    if (uri == NULL) {
		ans = xmlCatalogResolvePublic((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for PUBLIC %s\n", argv[i]);
		    exit_value = 4;
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    } else {
                xmlFreeURI(uri);
		ans = xmlCatalogResolveSystem((const xmlChar *) argv[i]);
		if (ans == NULL) {
		    printf("No entry for SYSTEM %s\n", argv[i]);
		    ans = xmlCatalogResolveURI ((const xmlChar *) argv[i]);
		    if (ans == NULL) {
			printf ("No entry for URI %s\n", argv[i]);
		        exit_value = 4;
		    } else {
		        printf("%s\n", (char *) ans);
			xmlFree (ans);
		    }
		} else {
		    printf("%s\n", (char *) ans);
		    xmlFree(ans);
		}
	    }
	}
    }
    if ((!sgml) && ((add) || (del) || (create) || (convert))) {
	if (noout && filename && *filename) {
	    FILE *out;

	    out = fopen(filename, "w");
	    if (out == NULL) {
		fprintf(stderr, "could not open %s for saving\n", filename);
		exit_value = 2;
		noout = 0;
	    } else {
		xmlCatalogDump(out);
	    }
	} else {
	    xmlCatalogDump(stdout);
	}
    }

    /*
     * Cleanup and check for memory leaks
     */
    xmlCleanupParser();
    xmlMemoryDump();
    return(exit_value);
}